

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

void bootstrap_set_system(ecs_world_t *world,char *name,char *expr,ecs_iter_action_t action)

{
  ecs_entity_t entity;
  ecs_query_t *query;
  ecs_sig_t sig;
  ecs_sig_t local_68;
  char *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_68.name = (char *)0x0;
  local_68.expr = (char *)0x0;
  local_68.columns = (ecs_vector_t *)0x0;
  local_40 = 0;
  uStack_38 = 0;
  local_48 = name;
  entity = ecs_set_ptr_w_entity(world,0,6,0x18,&local_48);
  ecs_add_entity(world,entity,0x10b);
  ecs_sig_init(world,name,expr,&local_68);
  query = ecs_query_new_w_sig(world,entity,&local_68);
  ecs_init_system(world,entity,action,query,(void *)0x0);
  return;
}

Assistant:

static
void bootstrap_set_system(
    ecs_world_t *world,
    const char *name,
    const char *expr,
    ecs_iter_action_t action)
{
    ecs_sig_t sig = {0};
    ecs_entity_t sys = ecs_set(world, 0, EcsName, {.value = name});
    ecs_add_entity(world, sys, EcsOnSet);
    ecs_sig_init(world, name, expr, &sig);
    ecs_query_t *query = ecs_query_new_w_sig(world, sys, &sig);
    ecs_init_system(world, sys, action, query, NULL);
}